

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O2

bool __thiscall QToolBarExtension::event(QToolBarExtension *this,QEvent *event)

{
  bool bVar1;
  
  if (*(short *)(event + 8) == 0x5a) {
    setOrientation(this,*(Orientation *)(this + 0x28));
  }
  bVar1 = QToolButton::event((QToolButton *)this,event);
  return bVar1;
}

Assistant:

bool QToolBarExtension::event(QEvent *event)
{
    switch (event->type()) {
    case QEvent::LayoutDirectionChange:
        setOrientation(m_orientation);
        break;
    default:
        break;
    }
    return QToolButton::event(event);
}